

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spritesheet.cpp
# Opt level: O3

void __thiscall Rml::SpritesheetList::Merge(SpritesheetList *this,SpritesheetList *other)

{
  NodePtr pDVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong *puVar5;
  type pSVar6;
  ulong uVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite>
  *pair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  char *pcVar8;
  NodePtr pDVar9;
  uint8_t *puVar10;
  ulong *puVar11;
  const_iterator cVar12;
  
  ::std::
  vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Rml::Spritesheet_const>const*,std::vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>>>
            ((vector<std::shared_ptr<Rml::Spritesheet_const>,std::allocator<std::shared_ptr<Rml::Spritesheet_const>>>
              *)this,(this->spritesheets).
                     super__Vector_base<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
             (other->spritesheets).
             super__Vector_base<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (other->spritesheets).
             super__Vector_base<std::shared_ptr<const_Rml::Spritesheet>,_std::allocator<std::shared_ptr<const_Rml::Spritesheet>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->sprite_map,(other->sprite_map).mNumElements + (this->sprite_map).mNumElements);
  cVar12 = robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Sprite,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cbegin(&other->sprite_map);
  pDVar9 = cVar12.mKeyVals;
  pDVar1 = (NodePtr)(other->sprite_map).mInfo;
  while (pDVar9 != pDVar1) {
    puVar10 = cVar12.mInfo;
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cVar12.mKeyVals;
    pSVar6 = robin_hood::detail::
             Table<true,80ul,std::__cxx11::string,Rml::Sprite,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
             ::doCreateByKey<std::__cxx11::string_const&,Rml::Sprite>
                       ((Table<true,80ul,std::__cxx11::string,Rml::Sprite,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                         *)&this->sprite_map,key);
    pSVar6->sprite_sheet = (Spritesheet *)key[1].field_2._M_allocated_capacity;
    uVar3 = *(undefined4 *)&key[1]._M_string_length;
    uVar4 = *(undefined4 *)((long)&key[1]._M_string_length + 4);
    (pSVar6->rectangle).p0 = (Vector2Type)key[1]._M_dataplus._M_p;
    (pSVar6->rectangle).p1.x = (float)uVar3;
    (pSVar6->rectangle).p1.y = (float)uVar4;
    pcVar8 = key[1].field_2._M_local_buf + 8;
    uVar7 = *(ulong *)(puVar10 + 1);
    if (uVar7 == 0) {
      puVar5 = (ulong *)(puVar10 + 9);
      do {
        puVar11 = puVar5;
        pcVar8 = pcVar8 + 0x1c0;
        uVar7 = *puVar11;
        puVar5 = puVar11 + 1;
      } while (uVar7 == 0);
    }
    else {
      puVar11 = (ulong *)(puVar10 + 1);
    }
    uVar2 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar7 = uVar2 >> 3 & 0x1fffffff;
    pDVar9 = (NodePtr)(pcVar8 + uVar7 * 0x38);
    cVar12.mInfo = (uint8_t *)((long)puVar11 + uVar7);
    cVar12.mKeyVals = pDVar9;
  }
  return;
}

Assistant:

void SpritesheetList::Merge(const SpritesheetList& other)
{
	spritesheets.insert(spritesheets.end(), other.spritesheets.begin(), other.spritesheets.end());
	sprite_map.reserve(sprite_map.size() + other.sprite_map.size());

	for (auto& pair : other.sprite_map)
	{
		const String& sprite_name = pair.first;
		const Sprite& sprite = pair.second;

		// Add the sprite into our map. If a sprite with the same name exists, it will be overwritten by the other sprite.
		sprite_map[sprite_name] = sprite;
	}
}